

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwsac.c
# Opt level: O3

int lwsac_extend(lwsac *head,int amount)

{
  lwsac *plVar1;
  ulong __n;
  bool bVar2;
  
  if (head == (lwsac *)0x0) {
    __assert_fail("head",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/misc/lwsac/lwsac.c"
                  ,0x4e,"int lwsac_extend(struct lwsac *, int)");
  }
  plVar1 = head[1].next;
  if (plVar1 != (lwsac *)0x0) {
    __n = (long)amount + 7U & 0xfffffffffffffff8;
    bVar2 = plVar1->alloc_size - plVar1->ofs < __n;
    if (!bVar2) {
      memset((void *)((long)&plVar1->next + plVar1->ofs),0,__n);
      plVar1->ofs = plVar1->ofs + __n;
    }
    return (uint)bVar2;
  }
  __assert_fail("bf",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/misc/lwsac/lwsac.c"
                ,0x52,"int lwsac_extend(struct lwsac *, int)");
}

Assistant:

int
lwsac_extend(struct lwsac *head, int amount)
{
	struct lwsac_head *lachead;
	struct lwsac *bf;

	assert(head);
	lachead = (struct lwsac_head *)&head[1];

	bf = lachead->curr;
	assert(bf);

	if (bf->alloc_size - bf->ofs < lwsac_align(amount))
		return 1;

	/* memset so constant folding never sees uninitialized data */

	memset(((uint8_t *)bf) + bf->ofs, 0, lwsac_align(amount));
	bf->ofs += lwsac_align(amount);

	return 0;
}